

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallImportedRuntimeArtifactsGenerator::cmInstallImportedRuntimeArtifactsGenerator
          (cmInstallImportedRuntimeArtifactsGenerator *this,string *targetName,string *dest,
          string *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string *component,MessageLevel message,bool exclude_from_all,bool optional
          ,cmListFileBacktrace backtrace)

{
  cmListFileBacktrace local_88;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)dest);
  std::__cxx11::string::string((string *)&local_70,(string *)component);
  local_88.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            ((backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->Value).Name._M_dataplus._M_p;
  local_88.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->Value).Name._M_string_length;
  ((backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->Value).Name._M_string_length = 0;
  ((backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->Value).Name._M_dataplus._M_p = (pointer)0x0;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_50,configurations,&local_70,message,
             exclude_from_all,false,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallImportedRuntimeArtifactsGenerator_00aa9228;
  std::__cxx11::string::string((string *)&this->TargetName,(string *)targetName);
  std::__cxx11::string::string((string *)&this->FilePermissions,(string *)file_permissions);
  this->Optional = optional;
  (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  return;
}

Assistant:

cmInstallImportedRuntimeArtifactsGenerator::
  cmInstallImportedRuntimeArtifactsGenerator(
    std::string targetName, std::string const& dest,
    std::string file_permissions,
    std::vector<std::string> const& configurations,
    std::string const& component, MessageLevel message, bool exclude_from_all,
    bool optional, cmListFileBacktrace backtrace)
  : cmInstallGenerator(dest, configurations, component, message,
                       exclude_from_all, false, std::move(backtrace))
  , TargetName(std::move(targetName))
  , FilePermissions(std::move(file_permissions))
  , Optional(optional)
{
  this->ActionsPerConfig = true;
}